

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O2

void __thiscall Camera::updateCameraVectors(Camera *this)

{
  float fVar1;
  float fVar2;
  vec<3,_float,_(glm::qualifier)0> vVar3;
  vec3 front;
  vec<3,_float,_(glm::qualifier)0> local_30;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_24;
  float local_20;
  float local_1c;
  
  fVar1 = cosf(this->Yaw * 0.017453292);
  fVar2 = cosf(this->Pitch * 0.017453292);
  local_24.x = fVar2 * fVar1;
  local_20 = sinf(this->Pitch * 0.017453292);
  fVar1 = sinf(this->Yaw * 0.017453292);
  local_1c = cosf(this->Pitch * 0.017453292);
  local_1c = local_1c * fVar1;
  vVar3 = glm::detail::compute_normalize<3,_float,_(glm::qualifier)0,_false>::call
                    ((vec<3,_float,_(glm::qualifier)0> *)&local_24);
  (this->Front).field_0 = vVar3.field_0;
  (this->Front).field_1 = vVar3.field_1;
  (this->Front).field_2 = vVar3.field_2;
  local_30 = glm::detail::compute_cross<float,_(glm::qualifier)0,_false>::call
                       (&this->Front,&this->WorldUp);
  vVar3 = glm::detail::compute_normalize<3,_float,_(glm::qualifier)0,_false>::call(&local_30);
  (this->Right).field_0 = vVar3.field_0;
  (this->Right).field_1 = vVar3.field_1;
  (this->Right).field_2 = vVar3.field_2;
  local_30 = glm::detail::compute_cross<float,_(glm::qualifier)0,_false>::call
                       (&this->Right,&this->Front);
  vVar3 = glm::detail::compute_normalize<3,_float,_(glm::qualifier)0,_false>::call(&local_30);
  (this->Up).field_0 = vVar3.field_0;
  (this->Up).field_1 = vVar3.field_1;
  (this->Up).field_2 = vVar3.field_2;
  return;
}

Assistant:

void Camera::updateCameraVectors() {
    vec3 front;
    front.x = cos(radians(Yaw)) * cos(radians(Pitch));
    front.y = sin(radians(Pitch));
    front.z = sin(radians(Yaw)) * cos(radians(Pitch));

    Front = normalize(front);

    Right = normalize(cross(Front, WorldUp));
    Up = normalize((cross(Right, Front)));
}